

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

double fasttext::updateArgGauss<double>
                 (double val,double min,double max,double startSigma,double endSigma,double t,
                 bool linear,minstd_rand *rng)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 extraout_var [56];
  
  auVar1._0_8_ = getArgGauss<double>(val,rng,startSigma,endSigma,t,linear);
  auVar1._8_56_ = extraout_var;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = max;
  auVar2 = vminsd_avx(auVar2,auVar1._0_16_);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = min;
  auVar2 = vmaxsd_avx(auVar3,auVar2);
  return auVar2._0_8_;
}

Assistant:

T updateArgGauss(
    T val,
    T min,
    T max,
    double startSigma,
    double endSigma,
    double t,
    bool linear,
    std::minstd_rand& rng) {
  T retVal = getArgGauss(val, rng, startSigma, endSigma, t, linear);
  if (retVal > max) {
    retVal = max;
  }
  if (retVal < min) {
    retVal = min;
  }
  return retVal;
}